

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O0

void __thiscall
polyscope::CurveNetwork::fillNodeGeometryBuffers(CurveNetwork *this,ShaderProgram *program)

{
  bool bVar1;
  ManagedBuffer<float> *in_RSI;
  CurveNetwork *in_stack_00000030;
  CurveNetworkNodeScalarQuantity *nodeRadQ;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined1 local_98 [23];
  allocator local_81;
  string local_80 [32];
  CurveNetworkNodeScalarQuantity *local_60;
  undefined1 local_58 [39];
  allocator local_31;
  string local_30 [32];
  ManagedBuffer<float> *local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"a_position",&local_31);
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::getRenderAttributeBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)in_RSI);
  (*in_RSI->_vptr_ManagedBuffer[0x13])(in_RSI,local_30,local_58);
  std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
            ((shared_ptr<polyscope::render::AttributeBuffer> *)0x4ad7d0);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  bVar1 = std::operator!=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if (bVar1) {
    local_60 = resolveNodeRadiusQuantity(in_stack_00000030);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"a_pointRadius",&local_81);
    render::ManagedBuffer<float>::getRenderAttributeBuffer(in_RSI);
    (*local_10->_vptr_ManagedBuffer[0x13])(local_10,local_80,local_98);
    std::shared_ptr<polyscope::render::AttributeBuffer>::~shared_ptr
              ((shared_ptr<polyscope::render::AttributeBuffer> *)0x4ad88d);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  return;
}

Assistant:

void CurveNetwork::fillNodeGeometryBuffers(render::ShaderProgram& program) {
  program.setAttribute("a_position", nodePositions.getRenderAttributeBuffer());

  if (nodeRadiusQuantityName != "") {
    CurveNetworkNodeScalarQuantity& nodeRadQ = resolveNodeRadiusQuantity();
    program.setAttribute("a_pointRadius", nodeRadQ.values.getRenderAttributeBuffer());
  }
}